

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_associative_containers.h
# Opt level: O0

set<int,_std::less<int>,_std::allocator<int>_> *
testinator::anon_unknown_6::Arbitrary_Assoc<std::set<int,_std::less<int>,_std::allocator<int>_>_>::
generate(set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,size_t generation,
        unsigned_long randomSeed)

{
  anon_class_16_2_2856ea55 __gen;
  iterator __i;
  ulong uVar1;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> __first;
  size_t n;
  unsigned_long local_20;
  unsigned_long randomSeed_local;
  size_t generation_local;
  set<int,_std::less<int>,_std::allocator<int>_> *v;
  
  local_20 = randomSeed;
  randomSeed_local = generation;
  generation_local = (size_t)__return_storage_ptr__;
  ::std::set<int,_std::less<int>,_std::allocator<int>_>::set(__return_storage_ptr__);
  if (randomSeed_local != 0) {
    uVar1 = randomSeed_local / 100;
    __i = ::std::set<int,_std::less<int>,_std::allocator<int>_>::begin(__return_storage_ptr__);
    __first = ::std::inserter<std::set<int,std::less<int>,std::allocator<int>>>
                        (__return_storage_ptr__,__i);
    __gen.randomSeed = &local_20;
    __gen.generation = &randomSeed_local;
    ::std::
    generate_n<std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,unsigned_long,testinator::(anonymous_namespace)::Arbitrary_Assoc<std::set<int,std::less<int>,std::allocator<int>>>::generate(unsigned_long,unsigned_long)::_lambda()_1_>
              (__first,uVar1 * 5 + 5,__gen);
  }
  return __return_storage_ptr__;
}

Assistant:

static C generate(std::size_t generation, unsigned long int randomSeed)
      {
        C v;
        if (generation == 0) return v;
        std::size_t n = N * ((generation / 100) + 1);
        std::generate_n(
            std::inserter(v, v.begin()), n,
            [&] () { return Arbitrary<V>::generate(generation++, randomSeed++); });
        return v;
      }